

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_dropt.c
# Opt level: O0

dropt_error
handle_ip_address(dropt_context *context,dropt_option *option,dropt_char *optionArgument,void *dest)

{
  int iVar1;
  ushort **ppuVar2;
  byte *local_60;
  dropt_char *p;
  uint *out;
  size_t i;
  uint octet [4];
  dropt_error local_2c;
  dropt_error err;
  void *dest_local;
  dropt_char *optionArgument_local;
  dropt_option *option_local;
  dropt_context *context_local;
  
  local_2c = 0;
  if (dest == (void *)0x0) {
    __assert_fail("out != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/test_dropt.c"
                  ,0xaa,
                  "dropt_error handle_ip_address(dropt_context *, const dropt_option *, const dropt_char *, void *)"
                 );
  }
  if ((optionArgument == (dropt_char *)0x0) ||
     (local_60 = (byte *)optionArgument, *optionArgument == '\0')) {
    local_2c = 5;
  }
  else {
    for (; *local_60 != 0; local_60 = local_60 + 1) {
      ppuVar2 = __ctype_b_loc();
      if ((((*ppuVar2)[(int)(uint)*local_60] & 0x800) == 0) && (*local_60 != 0x2e)) {
        return 0x80;
      }
    }
    iVar1 = __isoc99_sscanf(optionArgument,"%u.%u.%u.%u",&i,(long)&i + 4,octet,octet + 1);
    if (iVar1 == 4) {
      for (out = (uint *)0x0; out < (uint *)0x4; out = (uint *)((long)out + 1)) {
        if (0xff < octet[(long)out + -2]) {
          return 0x80;
        }
      }
      *(uint *)dest = (int)i << 0x18 | i._4_4_ << 0x10 | octet[0] << 8 | octet[1];
    }
    else {
      local_2c = 0x80;
    }
  }
  return local_2c;
}

Assistant:

static dropt_error
handle_ip_address(dropt_context* context,
                  const dropt_option* option,
                  const dropt_char* optionArgument,
                  void* dest)
{
    dropt_error err = dropt_error_none;
    unsigned int octet[4];
    size_t i;

    unsigned int* out = dest;

    assert(out != NULL);

    if (optionArgument == NULL || optionArgument[0] == T('\0'))
    {
        err = dropt_error_insufficient_arguments;
        goto exit;
    }

    {
        const dropt_char* p = optionArgument;
        while (*p != T('\0'))
        {
            if (!istdigit(*p) && *p != T('.'))
            {
                err = my_dropt_error_bad_ip_address;
                goto exit;
            }
            p++;
        }
    }

    if (stscanf(optionArgument, T("%u.%u.%u.%u"),
                &octet[0], &octet[1], &octet[2], &octet[3])
        != ARRAY_LENGTH(octet))
    {
        err = my_dropt_error_bad_ip_address;
        goto exit;
    }

    for (i = 0; i < ARRAY_LENGTH(octet); i++)
    {
        if (octet[i] > 0xFF)
        {
            err = my_dropt_error_bad_ip_address;
            goto exit;
        }
    }

    *out = (octet[0] << 24) | (octet[1] << 16) | (octet[2] << 8) | octet[3];

exit:
    return err;
}